

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionInfo::ChCollisionInfo
          (ChCollisionInfo *this,ChCollisionInfo *other,bool swap)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  ChCollisionModel *pCVar4;
  ChCollisionShape *pCVar5;
  ChCollisionShape *pCVar6;
  undefined7 in_register_00000011;
  double dVar7;
  
  (this->vN).m_data[2] = 0.0;
  (this->vpA).m_data[0] = 0.0;
  (this->vpA).m_data[1] = 0.0;
  (this->vpA).m_data[2] = 0.0;
  (this->vpB).m_data[0] = 0.0;
  (this->vpB).m_data[1] = 0.0;
  (this->vpB).m_data[2] = 0.0;
  (this->vN).m_data[0] = 0.0;
  (this->vN).m_data[1] = 0.0;
  if ((int)CONCAT71(in_register_00000011,swap) == 0) {
    pCVar4 = other->modelB;
    pCVar5 = other->shapeA;
    pCVar6 = other->shapeB;
    this->modelA = other->modelA;
    this->modelB = pCVar4;
    this->shapeA = pCVar5;
    this->shapeB = pCVar6;
    if (other == this) goto LAB_00d381a5;
    (this->vpA).m_data[0] = (other->vpA).m_data[0];
    (this->vpA).m_data[1] = (other->vpA).m_data[1];
    (this->vpA).m_data[2] = (other->vpA).m_data[2];
    (this->vpB).m_data[0] = (other->vpB).m_data[0];
    (this->vpB).m_data[1] = (other->vpB).m_data[1];
    (this->vpB).m_data[2] = (other->vpB).m_data[2];
    (this->vN).m_data[0] = (other->vN).m_data[0];
    (this->vN).m_data[1] = (other->vN).m_data[1];
    dVar7 = (other->vN).m_data[2];
  }
  else {
    this->modelA = other->modelB;
    this->modelB = other->modelA;
    this->shapeA = other->shapeB;
    this->shapeB = other->shapeA;
    if (&other->vpB != &this->vpA) {
      (this->vpA).m_data[0] = (other->vpB).m_data[0];
      (this->vpA).m_data[1] = (other->vpB).m_data[1];
      (this->vpA).m_data[2] = (other->vpB).m_data[2];
    }
    if (&other->vpA != &this->vpB) {
      (this->vpB).m_data[0] = (other->vpA).m_data[0];
      (this->vpB).m_data[1] = (other->vpA).m_data[1];
      (this->vpB).m_data[2] = (other->vpA).m_data[2];
    }
    dVar7 = -(other->vN).m_data[2];
    uVar1 = *(uint *)((long)(other->vN).m_data + 4);
    uVar2 = *(undefined4 *)((other->vN).m_data + 1);
    uVar3 = *(uint *)((long)(other->vN).m_data + 0xc);
    *(undefined4 *)(this->vN).m_data = *(undefined4 *)(other->vN).m_data;
    *(uint *)((long)(this->vN).m_data + 4) = uVar1 ^ 0x80000000;
    *(undefined4 *)((this->vN).m_data + 1) = uVar2;
    *(uint *)((long)(this->vN).m_data + 0xc) = uVar3 ^ 0x80000000;
  }
  (this->vN).m_data[2] = dVar7;
LAB_00d381a5:
  dVar7 = other->eff_radius;
  this->distance = other->distance;
  this->eff_radius = dVar7;
  this->reaction_cache = other->reaction_cache;
  return;
}

Assistant:

inline ChVector<Real>::ChVector() {
    m_data[0] = 0;
    m_data[1] = 0;
    m_data[2] = 0;
}